

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_buffer.c
# Opt level: O0

int lj_cf_buffer_method_put(lua_State *L)

{
  TValue *pTVar1;
  cTValue *pcVar2;
  SBufExt *sb;
  long lVar3;
  ulong uVar4;
  SBufExt *sbx2;
  cTValue *mo;
  cTValue *o;
  ptrdiff_t narg;
  ptrdiff_t arg;
  SBufExt *sbx;
  lua_State *L_local;
  SBufExt *sbx_1;
  
  sb = buffer_tobuf(L);
  (sb->L).ptr64 = (ulong)L | (sb->L).ptr64 & 7;
  lVar3 = (long)L->top - (long)L->base >> 3;
  narg = 1;
  do {
    if (lVar3 <= narg) {
      L->top = L->base + 1;
      if (*(ulong *)((L->glref).ptr64 + 0x18) <= *(ulong *)((L->glref).ptr64 + 0x10)) {
        lj_gc_step(L);
      }
      return 1;
    }
    pTVar1 = L->base;
    sbx2 = (SBufExt *)0x0;
    while (mo = pTVar1 + narg, (int)(mo->field_4).it >> 0xf != -5) {
      if ((uint)((int)(mo->field_4).it >> 0xf) < 0xfffffff2) {
        lj_strfmt_putfnum((SBuf *)sb,0xf000035,mo->n);
        goto LAB_00157c78;
      }
      if (((int)(mo->field_4).it >> 0xf == -0xd) &&
         (*(char *)((mo->u64 & 0x7fffffffffff) + 10) == '\x03')) {
        uVar4 = mo->u64 & 0x7fffffffffff;
        if ((SBufExt *)(uVar4 + 0x30) == sb) {
          lj_err_arg(L,(int)narg + 1,LJ_ERR_BUFFER_SELF);
        }
        lj_buf_putmem((SBuf *)sb,*(void **)(uVar4 + 0x58),
                      (int)((SBufExt *)(uVar4 + 0x30))->w - (int)*(undefined8 *)(uVar4 + 0x58));
        goto LAB_00157c78;
      }
      if ((sbx2 != (SBufExt *)0x0) ||
         (sbx2 = (SBufExt *)lj_meta_lookup(L,mo,MM_tostring),
         *(uint64_t *)sbx2 == 0xffffffffffffffff)) {
        lj_err_argtype(L,(int)narg + 1,"string/number/__tostring");
      }
      pcVar2 = L->top;
      L->top = pcVar2 + 1;
      *pcVar2 = *(cTValue *)sbx2;
      pTVar1 = L->top;
      L->top = pTVar1 + 1;
      *pTVar1 = *mo;
      lua_call(L,1,1);
      pTVar1 = L->base;
      L->base[narg] = L->top[-1];
      L->top = L->base + lVar3;
    }
    lj_buf_putstr((SBuf *)sb,(GCstr *)(mo->u64 & 0x7fffffffffff));
LAB_00157c78:
    narg = narg + 1;
  } while( true );
}

Assistant:

LJLIB_CF(buffer_method_put)		LJLIB_REC(.)
{
  SBufExt *sbx = buffer_tobufw(L);
  ptrdiff_t arg, narg = L->top - L->base;
  for (arg = 1; arg < narg; arg++) {
    cTValue *o = &L->base[arg], *mo = NULL;
  retry:
    if (tvisstr(o)) {
      lj_buf_putstr((SBuf *)sbx, strV(o));
    } else if (tvisint(o)) {
      lj_strfmt_putint((SBuf *)sbx, intV(o));
    } else if (tvisnum(o)) {
      lj_strfmt_putfnum((SBuf *)sbx, STRFMT_G14, numV(o));
    } else if (tvisbuf(o)) {
      SBufExt *sbx2 = bufV(o);
      if (sbx2 == sbx) lj_err_arg(L, (int)(arg+1), LJ_ERR_BUFFER_SELF);
      lj_buf_putmem((SBuf *)sbx, sbx2->r, sbufxlen(sbx2));
    } else if (!mo && !tvisnil(mo = lj_meta_lookup(L, o, MM_tostring))) {
      /* Call __tostring metamethod inline. */
      copyTV(L, L->top++, mo);
      copyTV(L, L->top++, o);
      lua_call(L, 1, 1);
      o = &L->base[arg];  /* The stack may have been reallocated. */
      copyTV(L, &L->base[arg], L->top-1);
      L->top = L->base + narg;
      goto retry;  /* Retry with the result. */
    } else {
      lj_err_argtype(L, (int)(arg+1), "string/number/__tostring");
    }
    /* Probably not useful to inline other __tostring MMs, e.g. FFI numbers. */
  }
  L->top = L->base+1;  /* Chain buffer object. */
  lj_gc_check(L);
  return 1;
}